

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O3

ICommandQueueVk * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::GetCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  *this,SoftwareQueueIndex CommandQueueInd)

{
  char (*in_RCX) [34];
  string msg;
  string local_38;
  
  if (this->m_CmdQueueCount <= (ulong)CommandQueueInd.m_Value) {
    FormatString<char[26],char[34]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CommandQueueInd < m_CmdQueueCount",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xf6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_CommandQueues[CommandQueueInd.m_Value].CmdQueue.m_pObject;
}

Assistant:

const CommandQueueType& GetCommandQueue(SoftwareQueueIndex CommandQueueInd) const
    {
        VERIFY_EXPR(CommandQueueInd < m_CmdQueueCount);
        return *m_CommandQueues[CommandQueueInd].CmdQueue;
    }